

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cc
# Opt level: O2

string * bssl::ReadTestFileToString(string *__return_storage_ptr__,string *file_path_ascii)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  ::std::operator+(&local_30,"pki/",file_path_ascii);
  GetTestData_abi_cxx11_(__return_storage_ptr__,local_30._M_dataplus._M_p);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string ReadTestFileToString(const std::string &file_path_ascii) {
  return GetTestData(("pki/" + file_path_ascii).c_str());
}